

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
~PriorityQueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  
  ~PriorityQueue(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

inline
    PriorityQueue<T>::~PriorityQueue() {}